

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_integration_rule.unit.cpp
# Opt level: O2

void __thiscall
TestCreateIntegrationRule_TestCreateIntegrationRule_Table_Test::
~TestCreateIntegrationRule_TestCreateIntegrationRule_Table_Test
          (TestCreateIntegrationRule_TestCreateIntegrationRule_Table_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(TestCreateIntegrationRule, TestCreateIntegrationRule_Table) {
	SCOPED_TRACE("Begin Test: Create Table Integration Rule.");

	std::string line = "Pre-weighted Table";

	Integration_Rule rule = create_integration_rule(line);

	EXPECT_EQ(rule.type, Integration_Rule_Type::TABLE);

	line = "Pre-weighted Table (Normalized, k=1.0)";
	rule = create_integration_rule(line);

	EXPECT_EQ(rule.type, Integration_Rule_Type::TABLE);
	EXPECT_EQ(rule.k, 1.0);
}